

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterHyperCoDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  uint *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int32_t iVar11;
  cpp_dec_float<100U,_int,_void> *pcVar12;
  int iVar13;
  int iVar14;
  int *piVar15;
  DataKey DVar16;
  fpclass_type fVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar21;
  pointer pnVar22;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_33c;
  cpp_dec_float<100U,_int,_void> local_338;
  pointer local_2e0;
  cpp_dec_float<100U,_int,_void> local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_280;
  cpp_dec_float<100U,_int,_void> *local_278;
  DIdxSet *local_270;
  cpp_dec_float<100U,_int,_void> local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  devexpr local_178 [8];
  uint auStack_170 [2];
  uint local_168 [2];
  uint auStack_160 [2];
  uint local_158 [2];
  uint auStack_150 [2];
  uint local_148 [2];
  undefined8 uStack_140;
  int local_138;
  byte local_134;
  ulong local_130;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  devexpr local_88 [8];
  uint auStack_80 [2];
  uint local_78 [2];
  uint auStack_70 [2];
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  int local_48;
  byte local_44;
  ulong local_40;
  
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar3 = (pSVar2->theTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_2e0 = (pSVar2->weights).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_278 = &best->m_backend;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_268,-1,(type *)0x0);
  local_338.fpclass = cpp_dec_float_finite;
  local_338.prec_elem = 0x10;
  local_338.data._M_elems[0] = 0;
  local_338.data._M_elems[1] = 0;
  local_338.data._M_elems[2] = 0;
  local_338.data._M_elems[3] = 0;
  local_338.data._M_elems[4] = 0;
  local_338.data._M_elems[5] = 0;
  local_338.data._M_elems[6] = 0;
  local_338.data._M_elems[7] = 0;
  local_338.data._M_elems[8] = 0;
  local_338.data._M_elems[9] = 0;
  local_338.data._M_elems[10] = 0;
  local_338.data._M_elems[0xb] = 0;
  local_338.data._M_elems[0xc] = 0;
  local_338.data._M_elems[0xd] = 0;
  local_338.data._M_elems._56_5_ = 0;
  local_338.data._M_elems[0xf]._1_3_ = 0;
  local_338.exp = 0;
  local_338.neg = false;
  lVar19 = (long)(this->bestPricesCo).super_IdxSet.num;
  if (lVar19 < 1) {
    local_33c = -1;
  }
  else {
    local_280 = &this->last;
    uVar20 = lVar19 + 1;
    local_33c = -1;
    do {
      piVar15 = (this->bestPricesCo).super_IdxSet.idx;
      iVar14 = piVar15[uVar20 - 2];
      local_338.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[iVar14].m_backend.data;
      local_338.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[iVar14].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar3[iVar14].m_backend.data + 0x10);
      local_338.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_338.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar3[iVar14].m_backend.data + 0x20);
      local_338.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_338.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar3[iVar14].m_backend.data + 0x30);
      local_338.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_338.data._M_elems._56_5_ = SUB85(uVar4,0);
      local_338.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_338.exp = pnVar3[iVar14].m_backend.exp;
      local_338.neg = pnVar3[iVar14].m_backend.neg;
      local_338.fpclass = pnVar3[iVar14].m_backend.fpclass;
      local_338.prec_elem = pnVar3[iVar14].m_backend.prec_elem;
      local_2d8.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      local_2d8.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
      local_2d8.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      local_2d8.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      local_2d8.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      local_2d8.data._M_elems._40_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
      local_2d8.data._M_elems._48_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
      local_2d8.data._M_elems._56_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
      local_2d8.exp = (feastol->m_backend).exp;
      local_2d8.neg = (feastol->m_backend).neg;
      local_2d8.fpclass = (feastol->m_backend).fpclass;
      local_2d8.prec_elem = (feastol->m_backend).prec_elem;
      if (local_2d8.data._M_elems[0] != 0 || local_2d8.fpclass != 0) {
        local_2d8.neg = (bool)(local_2d8.neg ^ 1);
      }
      if (local_338.fpclass == 2 || local_2d8.fpclass == 2) {
LAB_00463ddf:
        iVar13 = (this->bestPricesCo).super_IdxSet.num;
        (this->bestPricesCo).super_IdxSet.num = iVar13 + -1;
        piVar15[uVar20 - 2] = piVar15[(long)iVar13 + -1];
        (((this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->isInfeasibleCo).data[iVar14] = 0;
      }
      else {
        local_270 = (DIdxSet *)CONCAT44(local_270._4_4_,iVar14);
        pSVar21 = this;
        iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_338,&local_2d8);
        if (-1 < iVar13) {
          piVar15 = (this->bestPricesCo).super_IdxSet.idx;
          goto LAB_00463ddf;
        }
        uStack_50 = CONCAT35(local_338.data._M_elems[0xf]._1_3_,local_338.data._M_elems._56_5_);
        local_88 = (devexpr  [8])local_338.data._M_elems._0_8_;
        auStack_80[0] = local_338.data._M_elems[2];
        auStack_80[1] = local_338.data._M_elems[3];
        local_78[0] = local_338.data._M_elems[4];
        local_78[1] = local_338.data._M_elems[5];
        auStack_70[0] = local_338.data._M_elems[6];
        auStack_70[1] = local_338.data._M_elems[7];
        local_68[0] = local_338.data._M_elems[8];
        local_68[1] = local_338.data._M_elems[9];
        auStack_60[0] = local_338.data._M_elems[10];
        auStack_60[1] = local_338.data._M_elems[0xb];
        local_58[0] = local_338.data._M_elems[0xc];
        local_58[1] = local_338.data._M_elems[0xd];
        local_48 = local_338.exp;
        local_44 = local_338.neg;
        local_40._0_4_ = local_338.fpclass;
        local_40._4_4_ = local_338.prec_elem;
        local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_2e0[iVar14].m_backend.data;
        local_d8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&local_2e0[iVar14].m_backend.data + 8);
        puVar1 = (uint *)((long)&local_2e0[iVar14].m_backend.data + 0x10);
        local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&local_2e0[iVar14].m_backend.data + 0x20);
        local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&local_2e0[iVar14].m_backend.data + 0x30);
        local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
        local_d8.m_backend.exp = local_2e0[iVar14].m_backend.exp;
        local_d8.m_backend.neg = local_2e0[iVar14].m_backend.neg;
        local_d8.m_backend.fpclass = local_2e0[iVar14].m_backend.fpclass;
        local_d8.m_backend.prec_elem = local_2e0[iVar14].m_backend.prec_elem;
        local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
        local_128.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
        local_128.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
        local_128.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
        local_128.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
        local_128.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
        local_128.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
        local_128.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
        local_128.m_backend.exp = (feastol->m_backend).exp;
        local_128.m_backend.neg = (feastol->m_backend).neg;
        local_128.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_128.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_2d8,local_88,&local_d8,&local_128,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)pSVar21);
        pcVar12 = local_278;
        local_338.data._M_elems[0xc] = local_2d8.data._M_elems[0xc];
        local_338.data._M_elems[0xd] = local_2d8.data._M_elems[0xd];
        local_338.data._M_elems._56_5_ = local_2d8.data._M_elems._56_5_;
        local_338.data._M_elems[0xf]._1_3_ = local_2d8.data._M_elems[0xf]._1_3_;
        local_338.data._M_elems[8] = local_2d8.data._M_elems[8];
        local_338.data._M_elems[9] = local_2d8.data._M_elems[9];
        local_338.data._M_elems[10] = local_2d8.data._M_elems[10];
        local_338.data._M_elems[0xb] = local_2d8.data._M_elems[0xb];
        local_338.data._M_elems[4] = local_2d8.data._M_elems[4];
        local_338.data._M_elems[5] = local_2d8.data._M_elems[5];
        local_338.data._M_elems[6] = local_2d8.data._M_elems[6];
        local_338.data._M_elems[7] = local_2d8.data._M_elems[7];
        local_338.data._M_elems[0] = local_2d8.data._M_elems[0];
        local_338.data._M_elems[1] = local_2d8.data._M_elems[1];
        local_338.data._M_elems[2] = local_2d8.data._M_elems[2];
        local_338.data._M_elems[3] = local_2d8.data._M_elems[3];
        local_338.exp = local_2d8.exp;
        local_338.neg = local_2d8.neg;
        local_338.fpclass = local_2d8.fpclass;
        local_338.prec_elem = local_2d8.prec_elem;
        uVar18 = local_2d8._72_8_;
        if ((local_2d8.fpclass == 2) || (local_278->fpclass == cpp_dec_float_NaN)) {
LAB_0046407c:
          fVar17 = (fpclass_type)uVar18;
        }
        else {
          iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_338,local_278);
          uVar18 = local_338._72_8_ & 0xffffffff;
          if (iVar13 < 1) goto LAB_0046407c;
          pnVar22 = local_2e0 + iVar14;
          *(undefined8 *)((pcVar12->data)._M_elems + 0xc) = local_338.data._M_elems._48_8_;
          *(ulong *)((pcVar12->data)._M_elems + 0xe) =
               CONCAT35(local_338.data._M_elems[0xf]._1_3_,local_338.data._M_elems._56_5_);
          *(undefined8 *)((pcVar12->data)._M_elems + 8) = local_338.data._M_elems._32_8_;
          *(undefined8 *)((pcVar12->data)._M_elems + 10) = local_338.data._M_elems._40_8_;
          *(undefined8 *)((pcVar12->data)._M_elems + 4) = local_338.data._M_elems._16_8_;
          *(undefined8 *)((pcVar12->data)._M_elems + 6) = local_338.data._M_elems._24_8_;
          *(undefined8 *)(pcVar12->data)._M_elems = local_338.data._M_elems._0_8_;
          *(undefined8 *)((pcVar12->data)._M_elems + 2) = local_338.data._M_elems._8_8_;
          pcVar12->exp = local_338.exp;
          pcVar12->neg = local_338.neg;
          pcVar12->fpclass = local_338.fpclass;
          pcVar12->prec_elem = local_338.prec_elem;
          uVar4 = *(undefined8 *)&(pnVar22->m_backend).data;
          uVar5 = *(undefined8 *)((long)&(pnVar22->m_backend).data + 8);
          uVar6 = *(undefined8 *)((long)&(pnVar22->m_backend).data + 0x10);
          uVar7 = *(undefined8 *)((long)&(pnVar22->m_backend).data + 0x18);
          uVar8 = *(undefined8 *)((long)&(pnVar22->m_backend).data + 0x20);
          uVar9 = *(undefined8 *)((long)&(pnVar22->m_backend).data + 0x28);
          uVar10 = *(undefined8 *)((long)&(pnVar22->m_backend).data + 0x38);
          *(undefined8 *)((local_280->m_backend).data._M_elems + 0xc) =
               *(undefined8 *)((long)&(pnVar22->m_backend).data + 0x30);
          *(undefined8 *)((local_280->m_backend).data._M_elems + 0xe) = uVar10;
          *(undefined8 *)((local_280->m_backend).data._M_elems + 8) = uVar8;
          *(undefined8 *)((local_280->m_backend).data._M_elems + 10) = uVar9;
          *(undefined8 *)((local_280->m_backend).data._M_elems + 4) = uVar6;
          *(undefined8 *)((local_280->m_backend).data._M_elems + 6) = uVar7;
          *(undefined8 *)(local_280->m_backend).data._M_elems = uVar4;
          *(undefined8 *)((local_280->m_backend).data._M_elems + 2) = uVar5;
          (this->last).m_backend.exp = (pnVar22->m_backend).exp;
          (this->last).m_backend.neg = (pnVar22->m_backend).neg;
          iVar11 = (pnVar22->m_backend).prec_elem;
          (this->last).m_backend.fpclass = (pnVar22->m_backend).fpclass;
          (this->last).m_backend.prec_elem = iVar11;
          local_33c = (int)local_270;
          fVar17 = local_338.fpclass;
        }
        if (local_268.fpclass == cpp_dec_float_NaN || fVar17 == cpp_dec_float_NaN) {
LAB_004640c2:
          if (local_268.fpclass != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
            cpp_dec_float<long_long>(&local_2d8,0,(type *)0x0);
            iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&local_268,&local_2d8);
            if (iVar14 < 0) goto LAB_004640eb;
          }
        }
        else {
          iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_338,&local_268);
          if (-1 < iVar14) {
            goto LAB_004640c2;
          }
LAB_004640eb:
          local_268.data._M_elems[0xf]._1_3_ = local_338.data._M_elems[0xf]._1_3_;
          local_268.data._M_elems._56_5_ = local_338.data._M_elems._56_5_;
          local_268.data._M_elems[0xc] = local_338.data._M_elems[0xc];
          local_268.data._M_elems[0xd] = local_338.data._M_elems[0xd];
          local_268.data._M_elems[8] = local_338.data._M_elems[8];
          local_268.data._M_elems[9] = local_338.data._M_elems[9];
          local_268.data._M_elems[10] = local_338.data._M_elems[10];
          local_268.data._M_elems[0xb] = local_338.data._M_elems[0xb];
          local_268.data._M_elems[4] = local_338.data._M_elems[4];
          local_268.data._M_elems[5] = local_338.data._M_elems[5];
          local_268.data._M_elems[6] = local_338.data._M_elems[6];
          local_268.data._M_elems[7] = local_338.data._M_elems[7];
          local_268.data._M_elems[0] = local_338.data._M_elems[0];
          local_268.data._M_elems[1] = local_338.data._M_elems[1];
          local_268.data._M_elems[2] = local_338.data._M_elems[2];
          local_268.data._M_elems[3] = local_338.data._M_elems[3];
          local_268.exp = local_338.exp;
          local_268.neg = local_338.neg;
          local_268.fpclass = local_338.fpclass;
          local_268.prec_elem = local_338.prec_elem;
        }
      }
      uVar20 = uVar20 - 1;
    } while (1 < uVar20);
  }
  lVar19 = (long)(((this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver)->updateViolsCo).super_IdxSet.num;
  if (0 < lVar19) {
    local_270 = &this->bestPricesCo;
    local_280 = &this->last;
    uVar20 = lVar19 + 1;
    do {
      pSVar2 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      piVar15 = (pSVar2->isInfeasibleCo).data;
      iVar14 = (pSVar2->updateViolsCo).super_IdxSet.idx[uVar20 - 2];
      if (piVar15[iVar14] == 1) {
        local_338.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[iVar14].m_backend.data;
        local_338.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[iVar14].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar3[iVar14].m_backend.data + 0x10);
        local_338.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_338.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar3[iVar14].m_backend.data + 0x20);
        local_338.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_338.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar3[iVar14].m_backend.data + 0x30);
        local_338.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        uVar4 = *(undefined8 *)(puVar1 + 2);
        local_338.data._M_elems._56_5_ = SUB85(uVar4,0);
        local_338.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_338.exp = pnVar3[iVar14].m_backend.exp;
        local_338.neg = pnVar3[iVar14].m_backend.neg;
        local_338.fpclass = pnVar3[iVar14].m_backend.fpclass;
        local_338.prec_elem = pnVar3[iVar14].m_backend.prec_elem;
        local_2d8.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
        local_2d8.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
        local_2d8.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
        local_2d8.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
        local_2d8.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
        local_2d8.data._M_elems._40_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
        local_2d8.data._M_elems._48_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
        local_2d8.data._M_elems._56_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
        local_2d8.exp = (feastol->m_backend).exp;
        local_2d8.neg = (feastol->m_backend).neg;
        local_2d8.fpclass = (feastol->m_backend).fpclass;
        local_2d8.prec_elem = (feastol->m_backend).prec_elem;
        if (local_2d8.data._M_elems[0] != 0 || local_2d8.fpclass != 0) {
          local_2d8.neg = (bool)(local_2d8.neg ^ 1);
        }
        if (local_338.fpclass != 2 && local_2d8.fpclass != 2) {
          pSVar21 = this;
          iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_338,&local_2d8);
          if (iVar13 < 0) {
            uStack_140 = CONCAT35(local_338.data._M_elems[0xf]._1_3_,local_338.data._M_elems._56_5_)
            ;
            local_178 = (devexpr  [8])local_338.data._M_elems._0_8_;
            auStack_170[0] = local_338.data._M_elems[2];
            auStack_170[1] = local_338.data._M_elems[3];
            local_168[0] = local_338.data._M_elems[4];
            local_168[1] = local_338.data._M_elems[5];
            auStack_160[0] = local_338.data._M_elems[6];
            auStack_160[1] = local_338.data._M_elems[7];
            local_158[0] = local_338.data._M_elems[8];
            local_158[1] = local_338.data._M_elems[9];
            auStack_150[0] = local_338.data._M_elems[10];
            auStack_150[1] = local_338.data._M_elems[0xb];
            local_148[0] = local_338.data._M_elems[0xc];
            local_148[1] = local_338.data._M_elems[0xd];
            local_138 = local_338.exp;
            local_134 = local_338.neg;
            local_130._0_4_ = local_338.fpclass;
            local_130._4_4_ = local_338.prec_elem;
            local_1c8.m_backend.data._M_elems._0_8_ =
                 *(undefined8 *)&local_2e0[iVar14].m_backend.data;
            local_1c8.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((long)&local_2e0[iVar14].m_backend.data + 8);
            puVar1 = (uint *)((long)&local_2e0[iVar14].m_backend.data + 0x10);
            local_1c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_1c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = (uint *)((long)&local_2e0[iVar14].m_backend.data + 0x20);
            local_1c8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
            local_1c8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = (uint *)((long)&local_2e0[iVar14].m_backend.data + 0x30);
            local_1c8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
            local_1c8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
            local_1c8.m_backend.exp = local_2e0[iVar14].m_backend.exp;
            local_1c8.m_backend.neg = local_2e0[iVar14].m_backend.neg;
            local_1c8.m_backend.fpclass = local_2e0[iVar14].m_backend.fpclass;
            local_1c8.m_backend.prec_elem = local_2e0[iVar14].m_backend.prec_elem;
            local_218.m_backend.data._M_elems._0_8_ =
                 *(undefined8 *)(feastol->m_backend).data._M_elems;
            local_218.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
            local_218.m_backend.data._M_elems._16_8_ =
                 *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
            local_218.m_backend.data._M_elems._24_8_ =
                 *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
            local_218.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
            local_218.m_backend.data._M_elems._40_8_ =
                 *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
            local_218.m_backend.data._M_elems._48_8_ =
                 *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
            local_218.m_backend.data._M_elems._56_8_ =
                 *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
            local_218.m_backend.exp = (feastol->m_backend).exp;
            local_218.m_backend.neg = (feastol->m_backend).neg;
            local_218.m_backend.fpclass = (feastol->m_backend).fpclass;
            local_218.m_backend.prec_elem = (feastol->m_backend).prec_elem;
            devexpr::
            computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_2d8,local_178,&local_1c8,&local_218,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)pSVar21);
            local_338.data._M_elems[0xc] = local_2d8.data._M_elems[0xc];
            local_338.data._M_elems[0xd] = local_2d8.data._M_elems[0xd];
            local_338.data._M_elems._56_5_ = local_2d8.data._M_elems._56_5_;
            local_338.data._M_elems[0xf]._1_3_ = local_2d8.data._M_elems[0xf]._1_3_;
            local_338.data._M_elems[8] = local_2d8.data._M_elems[8];
            local_338.data._M_elems[9] = local_2d8.data._M_elems[9];
            local_338.data._M_elems[10] = local_2d8.data._M_elems[10];
            local_338.data._M_elems[0xb] = local_2d8.data._M_elems[0xb];
            local_338.data._M_elems[4] = local_2d8.data._M_elems[4];
            local_338.data._M_elems[5] = local_2d8.data._M_elems[5];
            local_338.data._M_elems[6] = local_2d8.data._M_elems[6];
            local_338.data._M_elems[7] = local_2d8.data._M_elems[7];
            local_338.data._M_elems[0] = local_2d8.data._M_elems[0];
            local_338.data._M_elems[1] = local_2d8.data._M_elems[1];
            local_338.data._M_elems[2] = local_2d8.data._M_elems[2];
            local_338.data._M_elems[3] = local_2d8.data._M_elems[3];
            local_338.exp = local_2d8.exp;
            local_338.neg = local_2d8.neg;
            local_338.fpclass = local_2d8.fpclass;
            local_338.prec_elem = local_2d8.prec_elem;
            if (((local_2d8.fpclass != 2) && (local_268.fpclass != cpp_dec_float_NaN)) &&
               (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (&local_338,&local_268), 0 < iVar13)) {
              if (((local_338.fpclass != cpp_dec_float_NaN) &&
                  (local_278->fpclass != cpp_dec_float_NaN)) &&
                 (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (&local_338,local_278), 0 < iVar13)) {
                pnVar22 = local_2e0 + iVar14;
                *(undefined8 *)
                 ((((cpp_dec_float<100U,_int,_void> *)&local_278->data)->data)._M_elems + 0xc) =
                     local_338.data._M_elems._48_8_;
                *(ulong *)((((cpp_dec_float<100U,_int,_void> *)&local_278->data)->data)._M_elems +
                          0xe) =
                     CONCAT35(local_338.data._M_elems[0xf]._1_3_,local_338.data._M_elems._56_5_);
                *(undefined8 *)
                 ((((cpp_dec_float<100U,_int,_void> *)&local_278->data)->data)._M_elems + 8) =
                     local_338.data._M_elems._32_8_;
                *(undefined8 *)
                 ((((cpp_dec_float<100U,_int,_void> *)&local_278->data)->data)._M_elems + 10) =
                     local_338.data._M_elems._40_8_;
                *(undefined8 *)
                 ((((cpp_dec_float<100U,_int,_void> *)&local_278->data)->data)._M_elems + 4) =
                     local_338.data._M_elems._16_8_;
                *(undefined8 *)
                 ((((cpp_dec_float<100U,_int,_void> *)&local_278->data)->data)._M_elems + 6) =
                     local_338.data._M_elems._24_8_;
                *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)&local_278->data)->data)._M_elems
                     = local_338.data._M_elems._0_8_;
                *(undefined8 *)
                 ((((cpp_dec_float<100U,_int,_void> *)&local_278->data)->data)._M_elems + 2) =
                     local_338.data._M_elems._8_8_;
                local_278->exp = local_338.exp;
                local_278->neg = local_338.neg;
                local_278->fpclass = local_338.fpclass;
                local_278->prec_elem = local_338.prec_elem;
                uVar4 = *(undefined8 *)&(pnVar22->m_backend).data;
                uVar5 = *(undefined8 *)((long)&(pnVar22->m_backend).data + 8);
                uVar6 = *(undefined8 *)((long)&(pnVar22->m_backend).data + 0x10);
                uVar7 = *(undefined8 *)((long)&(pnVar22->m_backend).data + 0x18);
                uVar8 = *(undefined8 *)((long)&(pnVar22->m_backend).data + 0x20);
                uVar9 = *(undefined8 *)((long)&(pnVar22->m_backend).data + 0x28);
                uVar10 = *(undefined8 *)((long)&(pnVar22->m_backend).data + 0x38);
                *(undefined8 *)((local_280->m_backend).data._M_elems + 0xc) =
                     *(undefined8 *)((long)&(pnVar22->m_backend).data + 0x30);
                *(undefined8 *)((local_280->m_backend).data._M_elems + 0xe) = uVar10;
                *(undefined8 *)((local_280->m_backend).data._M_elems + 8) = uVar8;
                *(undefined8 *)((local_280->m_backend).data._M_elems + 10) = uVar9;
                *(undefined8 *)((local_280->m_backend).data._M_elems + 4) = uVar6;
                *(undefined8 *)((local_280->m_backend).data._M_elems + 6) = uVar7;
                *(undefined8 *)(local_280->m_backend).data._M_elems = uVar4;
                *(undefined8 *)((local_280->m_backend).data._M_elems + 2) = uVar5;
                (this->last).m_backend.exp = (pnVar22->m_backend).exp;
                (this->last).m_backend.neg = (pnVar22->m_backend).neg;
                iVar11 = (pnVar22->m_backend).prec_elem;
                (this->last).m_backend.fpclass = (pnVar22->m_backend).fpclass;
                (this->last).m_backend.prec_elem = iVar11;
                local_33c = iVar14;
              }
              (((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->isInfeasibleCo).data[iVar14] = 2;
              DIdxSet::addIdx(local_270,iVar14);
            }
            goto LAB_004642b7;
          }
          piVar15 = (((this->
                      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thesolver)->isInfeasibleCo).data;
        }
        piVar15[iVar14] = 0;
      }
LAB_004642b7:
      uVar20 = uVar20 - 1;
    } while (1 < uVar20);
  }
  if (local_33c < 0) {
    DVar16.info = 0;
    DVar16.idx = -1;
  }
  else {
    DVar16 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::id((this->
                           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).thesolver,local_33c);
  }
  return (SPxId)DVar16;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterHyperCoDim(R& best, R feastol)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   R leastBest = -1;
   R x;
   int enterIdx = -1;
   int idx;

   // find the best price from short candidate list
   for(int i = bestPricesCo.size() - 1; i >= 0; --i)
   {
      idx = bestPricesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, pen[idx], feastol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = pen[idx];
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPricesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   //scan the updated indeces for a better price
   for(int i = this->thesolver->updateViolsCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViolsCo.index(i);

      // only look at indeces that were not checked already
      if(this->thesolver->isInfeasibleCo[idx] == this->VIOLATED)
      {
         x = test[idx];

         if(x < -feastol)
         {
            x = devexpr::computePrice(x, pen[idx], feastol);

            if(x > leastBest)
            {
               if(x > best)
               {
                  best = x;
                  enterIdx = idx;
                  last = pen[idx];
               }

               // put index into candidate list
               this->thesolver->isInfeasibleCo[idx] = this->VIOLATED_AND_CHECKED;
               bestPricesCo.addIdx(idx);
            }
         }
         else
         {
            this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);
   else
      return SPxId();
}